

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O3

double chrono::VangleRX<double>(ChVector<double> *va)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  dVar2 = va->m_data[1];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = va->m_data[2];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar2 * dVar2;
  auVar4 = vfmadd231sd_fma(auVar5,auVar4,auVar4);
  auVar4 = vsqrtsd_avx(auVar4,auVar4);
  if (2.2250738585072014e-308 <= auVar4._0_8_) {
    dVar3 = 1.0 / auVar4._0_8_;
    dVar1 = dVar3 * 0.0;
    if ((dVar1 != 1.0) || (NAN(dVar1))) {
      dVar2 = acos(dVar2 * dVar3);
      return dVar2;
    }
  }
  return 0.0;
}

Assistant:

double VangleRX(const ChVector<RealA>& va) {
    Vector vproj;
    vproj.x() = 0;
    vproj.y() = va.y();
    vproj.z() = va.z();
    vproj = Vnorm(vproj);
    if (vproj.x() == 1)
        return 0;
    return acos(vproj.y());
}